

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectStore.cpp
# Opt level: O3

void __thiscall ObjectStore::~ObjectStore(ObjectStore *this)

{
  pointer pcVar1;
  pointer ppOVar2;
  MutexFactory *this_00;
  pointer ppOVar3;
  MutexLocker lock;
  MutexLocker local_20;
  
  this->_vptr_ObjectStore = (_func_int **)&PTR__ObjectStore_0019db00;
  MutexLocker::MutexLocker(&local_20,this->storeMutex);
  ppOVar3 = (this->tokens).
            super__Vector_base<ObjectStoreToken_*,_std::allocator<ObjectStoreToken_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->tokens).super__Vector_base<ObjectStoreToken_*,_std::allocator<ObjectStoreToken_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppOVar3) {
    (this->tokens).super__Vector_base<ObjectStoreToken_*,_std::allocator<ObjectStoreToken_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppOVar3;
  }
  ppOVar2 = (this->allTokens).
            super__Vector_base<ObjectStoreToken_*,_std::allocator<ObjectStoreToken_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppOVar3 = (this->allTokens).
                 super__Vector_base<ObjectStoreToken_*,_std::allocator<ObjectStoreToken_*>_>._M_impl
                 .super__Vector_impl_data._M_start; ppOVar3 != ppOVar2; ppOVar3 = ppOVar3 + 1) {
    if (*ppOVar3 != (ObjectStoreToken *)0x0) {
      (*(*ppOVar3)->_vptr_ObjectStoreToken[0xd])();
      ppOVar2 = (this->allTokens).
                super__Vector_base<ObjectStoreToken_*,_std::allocator<ObjectStoreToken_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    }
  }
  MutexLocker::~MutexLocker(&local_20);
  this_00 = MutexFactory::i();
  MutexFactory::recycleMutex(this_00,this->storeMutex);
  pcVar1 = (this->storePath)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->storePath).field_2) {
    operator_delete(pcVar1);
  }
  ppOVar3 = (this->allTokens).
            super__Vector_base<ObjectStoreToken_*,_std::allocator<ObjectStoreToken_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppOVar3 != (pointer)0x0) {
    operator_delete(ppOVar3);
  }
  ppOVar3 = (this->tokens).
            super__Vector_base<ObjectStoreToken_*,_std::allocator<ObjectStoreToken_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppOVar3 != (pointer)0x0) {
    operator_delete(ppOVar3);
  }
  return;
}

Assistant:

ObjectStore::~ObjectStore()
{
	{
		MutexLocker lock(storeMutex);

		// Clean up
		tokens.clear();

		for (std::vector<ObjectStoreToken*>::iterator i = allTokens.begin(); i != allTokens.end(); i++)
		{
			delete *i;
		}
	}

	MutexFactory::i()->recycleMutex(storeMutex);
}